

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t read_part_content(curl_mimepart *part,char *buffer,size_t bufsize,_Bool *hasread)

{
  long *plVar1;
  curl_off_t *pcVar2;
  void *pvVar3;
  curl_read_callback p_Var4;
  bool bVar5;
  int iVar6;
  ulong __n;
  curl_mimepart *part_00;
  size_t sVar7;
  size_t sVar8;
  char *__src;
  size_t sVar9;
  long lVar10;
  
  sVar9 = part->lastreadstatus;
  if (sVar9 + 1 < 2) {
    return sVar9;
  }
  if (sVar9 - 0x10000000 < 2) {
    return sVar9;
  }
  if ((part->datasize == -1) || ((part->state).offset < part->datasize)) {
    if (part->kind == MIMEKIND_FILE) {
      if (((FILE *)part->fp != (FILE *)0x0) && (iVar6 = feof((FILE *)part->fp), iVar6 != 0))
      goto LAB_0014467b;
    }
    else if (part->kind == MIMEKIND_MULTIPART) {
      pvVar3 = part->arg;
      plVar1 = (long *)((long)pvVar3 + 0x58);
      sVar8 = 0;
      do {
        sVar7 = sVar8;
        if (bufsize == 0) break;
        __n = 0;
        if (8 < *(uint *)((long)pvVar3 + 0x48)) goto switchD_0014440f_caseD_1;
        part_00 = *(curl_mimepart **)((long)pvVar3 + 0x50);
        switch(*(uint *)((long)pvVar3 + 0x48)) {
        case 0:
        case 4:
          *(undefined4 *)((long)pvVar3 + 0x48) = 5;
          *(undefined8 *)((long)pvVar3 + 0x50) = *(undefined8 *)((long)pvVar3 + 8);
          *(undefined8 *)((long)pvVar3 + 0x58) = 2;
LAB_00144619:
          __n = 0;
          break;
        case 5:
          sVar7 = curlx_sotouz(*(curl_off_t *)((long)pvVar3 + 0x58));
          if (sVar7 < 4) {
            __n = 4 - sVar7;
            if (bufsize <= 4 - sVar7) {
              __n = bufsize;
            }
            memcpy(buffer,"\r\n--" + sVar7,__n);
            *(long *)((long)pvVar3 + 0x58) = *(long *)((long)pvVar3 + 0x58) + __n;
          }
          else {
            __n = 0;
          }
          if (__n == 0) {
            *(undefined4 *)((long)pvVar3 + 0x48) = 6;
LAB_0014460d:
            *(curl_mimepart **)((long)pvVar3 + 0x50) = part_00;
            *(undefined8 *)((long)pvVar3 + 0x58) = 0;
            goto LAB_00144619;
          }
          break;
        case 6:
          if (part_00 == (curl_mimepart *)0x0) {
            sVar7 = curlx_sotouz(*plVar1);
            if (sVar7 < 0x2e) goto LAB_0014456c;
            if (3 < sVar7 - 0x2e) goto LAB_001445ed;
            __src = "Content-Transfer-Encoding: %s" + sVar7 + 0x19;
            lVar10 = 0x32;
LAB_0014457b:
            __n = lVar10 - sVar7;
            if (bufsize <= lVar10 - sVar7) {
              __n = bufsize;
            }
            memcpy(buffer,__src,__n);
            *plVar1 = *plVar1 + __n;
          }
          else {
            sVar7 = curlx_sotouz(*plVar1);
            if (sVar7 < 0x2e) {
LAB_0014456c:
              __src = (char *)((long)pvVar3 + sVar7 + 0x18);
              lVar10 = 0x2e;
              goto LAB_0014457b;
            }
            if (sVar7 - 0x2e < 2) {
              __src = "skipped cookie with bad tailmatch domain: %s" + sVar7 + 0x23;
              lVar10 = 0x30;
              goto LAB_0014457b;
            }
LAB_001445ed:
            __n = 0;
          }
          if (__n == 0) {
            *(undefined4 *)((long)pvVar3 + 0x48) = 7;
            goto LAB_0014460d;
          }
          break;
        case 7:
          if (part_00 == (curl_mimepart *)0x0) {
            *(undefined4 *)((long)pvVar3 + 0x48) = 8;
            *(undefined8 *)((long)pvVar3 + 0x50) = 0;
            *(undefined8 *)((long)pvVar3 + 0x58) = 0;
            goto LAB_00144619;
          }
          __n = readback_part(part_00,buffer,bufsize,hasread);
          if ((1 < __n + 2) && (1 < __n - 0x10000000)) {
            if (__n == 0) {
              part_00 = part_00->nextpart;
              *(undefined4 *)((long)pvVar3 + 0x48) = 5;
              goto LAB_0014460d;
            }
            break;
          }
          sVar9 = __n;
          if (sVar8 != 0) {
            sVar9 = sVar8;
          }
          bVar5 = false;
          goto LAB_00144627;
        case 8:
          bVar5 = false;
          sVar9 = sVar8;
          goto LAB_00144627;
        }
switchD_0014440f_caseD_1:
        sVar8 = sVar8 + __n;
        buffer = buffer + __n;
        bufsize = bufsize - __n;
        bVar5 = true;
LAB_00144627:
        sVar7 = sVar9;
      } while (bVar5);
      goto LAB_0014467e;
    }
    p_Var4 = part->readfunc;
    if (p_Var4 != (curl_read_callback)0x0) {
      if ((part->flags & 4) == 0) {
        if (*hasread != false) {
          return 0xfffffffffffffffe;
        }
        *hasread = true;
      }
      sVar7 = (*p_Var4)(buffer,1,bufsize,part->arg);
      goto LAB_0014467e;
    }
  }
LAB_0014467b:
  sVar7 = 0;
LAB_0014467e:
  if ((1 < sVar7 + 1) && (1 < sVar7 - 0x10000000)) {
    if (sVar7 == 0xfffffffffffffffe) {
      return 0xfffffffffffffffe;
    }
    pcVar2 = &(part->state).offset;
    *pcVar2 = *pcVar2 + sVar7;
  }
  part->lastreadstatus = sVar7;
  return sVar7;
}

Assistant:

static size_t read_part_content(curl_mimepart *part,
                                char *buffer, size_t bufsize, bool *hasread)
{
  size_t sz = 0;

  switch(part->lastreadstatus) {
  case 0:
  case CURL_READFUNC_ABORT:
  case CURL_READFUNC_PAUSE:
  case READ_ERROR:
    return part->lastreadstatus;
  default:
    break;
  }

  /* If we can determine we are at end of part data, spare a read. */
  if(part->datasize != (curl_off_t) -1 &&
     part->state.offset >= part->datasize) {
    /* sz is already zero. */
  }
  else {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      /*
       * Cannot be processed as other kinds since read function requires
       * an additional parameter and is highly recursive.
       */
       sz = mime_subparts_read(buffer, 1, bufsize, part->arg, hasread);
       break;
    case MIMEKIND_FILE:
      if(part->fp && feof(part->fp))
        break;  /* At EOF. */
      FALLTHROUGH();
    default:
      if(part->readfunc) {
        if(!(part->flags & MIME_FAST_READ)) {
          if(*hasread)
            return STOP_FILLING;
          *hasread = TRUE;
        }
        sz = part->readfunc(buffer, 1, bufsize, part->arg);
      }
      break;
    }
  }

  switch(sz) {
  case STOP_FILLING:
    break;
  case 0:
  case CURL_READFUNC_ABORT:
  case CURL_READFUNC_PAUSE:
  case READ_ERROR:
    part->lastreadstatus = sz;
    break;
  default:
    part->state.offset += sz;
    part->lastreadstatus = sz;
    break;
  }

  return sz;
}